

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

void log_device(cubeb_device_info *device_info)

{
  int iVar1;
  cubeb_log_level cVar2;
  cubeb_log_callback p_Var3;
  char *pcVar4;
  long in_RDI;
  char *devdeffmt;
  char *devstate;
  char *devtype;
  char devfmts [128];
  char *local_138;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char local_b8 [128];
  long local_38;
  
  local_b8[0x70] = '\0';
  local_b8[0x71] = '\0';
  local_b8[0x72] = '\0';
  local_b8[0x73] = '\0';
  local_b8[0x74] = '\0';
  local_b8[0x75] = '\0';
  local_b8[0x76] = '\0';
  local_b8[0x77] = '\0';
  local_b8[0x78] = '\0';
  local_b8[0x79] = '\0';
  local_b8[0x7a] = '\0';
  local_b8[0x7b] = '\0';
  local_b8[0x7c] = '\0';
  local_b8[0x7d] = '\0';
  local_b8[0x7e] = '\0';
  local_b8[0x7f] = '\0';
  local_b8[0x60] = '\0';
  local_b8[0x61] = '\0';
  local_b8[0x62] = '\0';
  local_b8[99] = '\0';
  local_b8[100] = '\0';
  local_b8[0x65] = '\0';
  local_b8[0x66] = '\0';
  local_b8[0x67] = '\0';
  local_b8[0x68] = '\0';
  local_b8[0x69] = '\0';
  local_b8[0x6a] = '\0';
  local_b8[0x6b] = '\0';
  local_b8[0x6c] = '\0';
  local_b8[0x6d] = '\0';
  local_b8[0x6e] = '\0';
  local_b8[0x6f] = '\0';
  local_b8[0x50] = '\0';
  local_b8[0x51] = '\0';
  local_b8[0x52] = '\0';
  local_b8[0x53] = '\0';
  local_b8[0x54] = '\0';
  local_b8[0x55] = '\0';
  local_b8[0x56] = '\0';
  local_b8[0x57] = '\0';
  local_b8[0x58] = '\0';
  local_b8[0x59] = '\0';
  local_b8[0x5a] = '\0';
  local_b8[0x5b] = '\0';
  local_b8[0x5c] = '\0';
  local_b8[0x5d] = '\0';
  local_b8[0x5e] = '\0';
  local_b8[0x5f] = '\0';
  local_b8[0x40] = '\0';
  local_b8[0x41] = '\0';
  local_b8[0x42] = '\0';
  local_b8[0x43] = '\0';
  local_b8[0x44] = '\0';
  local_b8[0x45] = '\0';
  local_b8[0x46] = '\0';
  local_b8[0x47] = '\0';
  local_b8[0x48] = '\0';
  local_b8[0x49] = '\0';
  local_b8[0x4a] = '\0';
  local_b8[0x4b] = '\0';
  local_b8[0x4c] = '\0';
  local_b8[0x4d] = '\0';
  local_b8[0x4e] = '\0';
  local_b8[0x4f] = '\0';
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  iVar1 = *(int *)(in_RDI + 0x28);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      local_c0 = "input";
      goto LAB_0010690b;
    }
    if (iVar1 == 2) {
      local_c0 = "output";
      goto LAB_0010690b;
    }
  }
  local_c0 = "unknown?";
LAB_0010690b:
  iVar1 = *(int *)(in_RDI + 0x2c);
  if (iVar1 == 0) {
    local_c8 = "disabled";
  }
  else if (iVar1 == 1) {
    local_c8 = "unplugged";
  }
  else if (iVar1 == 2) {
    local_c8 = "enabled";
  }
  else {
    local_c8 = "unknown?";
  }
  iVar1 = *(int *)(in_RDI + 0x38);
  if (iVar1 == 0x10) {
    local_d0 = "S16LE";
  }
  else if (iVar1 == 0x20) {
    local_d0 = "S16BE";
  }
  else if (iVar1 == 0x1000) {
    local_d0 = "F32LE";
  }
  else if (iVar1 == 0x2000) {
    local_d0 = "F32BE";
  }
  else {
    local_d0 = "unknown?";
  }
  local_38 = in_RDI;
  if ((*(uint *)(in_RDI + 0x34) & 0x10) != 0) {
    strcat(local_b8," S16LE");
  }
  if ((*(uint *)(local_38 + 0x34) & 0x20) != 0) {
    strcat(local_b8," S16BE");
  }
  if ((*(uint *)(local_38 + 0x34) & 0x1000) != 0) {
    strcat(local_b8," F32LE");
  }
  if ((*(uint *)(local_38 + 0x34) & 0x2000) != 0) {
    strcat(local_b8," F32BE");
  }
  cVar2 = cubeb_log_get_level();
  if ((cVar2 != CUBEB_LOG_DISABLED) &&
     (p_Var3 = cubeb_log_get_callback(), p_Var3 != (cubeb_log_callback)0x0)) {
    pcVar4 = "";
    if (*(int *)(local_38 + 0x30) != 0) {
      pcVar4 = " (PREFERRED)";
    }
    if (local_b8[0] == '\0') {
      local_138 = local_b8;
    }
    else {
      local_138 = local_b8 + 1;
    }
    cubeb_log_internal("cubeb.c",0x29e,
                       "DeviceID: \"%s\"%s\n\tName:\t\"%s\"\n\tGroup:\t\"%s\"\n\tVendor:\t\"%s\"\n\tType:\t%s\n\tState:\t%s\n\tMaximum channels:\t%u\n\tFormat:\t%s (0x%x) (default: %s)\n\tRate:\t[%u, %u] (default: %u)\n\tLatency: lo %u frames, hi %u frames"
                       ,*(undefined8 *)(local_38 + 8),pcVar4,*(undefined8 *)(local_38 + 0x10),
                       *(undefined8 *)(local_38 + 0x18),*(undefined8 *)(local_38 + 0x20),local_c0,
                       local_c8,*(undefined4 *)(local_38 + 0x3c),local_138,
                       *(undefined4 *)(local_38 + 0x34),local_d0,*(undefined4 *)(local_38 + 0x48),
                       *(undefined4 *)(local_38 + 0x44),*(undefined4 *)(local_38 + 0x40),
                       *(undefined4 *)(local_38 + 0x4c),*(undefined4 *)(local_38 + 0x50));
  }
  return;
}

Assistant:

static void
log_device(cubeb_device_info * device_info)
{
  char devfmts[128] = "";
  const char *devtype, *devstate, *devdeffmt;

  switch (device_info->type) {
  case CUBEB_DEVICE_TYPE_INPUT:
    devtype = "input";
    break;
  case CUBEB_DEVICE_TYPE_OUTPUT:
    devtype = "output";
    break;
  case CUBEB_DEVICE_TYPE_UNKNOWN:
  default:
    devtype = "unknown?";
    break;
  };

  switch (device_info->state) {
  case CUBEB_DEVICE_STATE_DISABLED:
    devstate = "disabled";
    break;
  case CUBEB_DEVICE_STATE_UNPLUGGED:
    devstate = "unplugged";
    break;
  case CUBEB_DEVICE_STATE_ENABLED:
    devstate = "enabled";
    break;
  default:
    devstate = "unknown?";
    break;
  };

  switch (device_info->default_format) {
  case CUBEB_DEVICE_FMT_S16LE:
    devdeffmt = "S16LE";
    break;
  case CUBEB_DEVICE_FMT_S16BE:
    devdeffmt = "S16BE";
    break;
  case CUBEB_DEVICE_FMT_F32LE:
    devdeffmt = "F32LE";
    break;
  case CUBEB_DEVICE_FMT_F32BE:
    devdeffmt = "F32BE";
    break;
  default:
    devdeffmt = "unknown?";
    break;
  };

  if (device_info->format & CUBEB_DEVICE_FMT_S16LE) {
    strcat(devfmts, " S16LE");
  }
  if (device_info->format & CUBEB_DEVICE_FMT_S16BE) {
    strcat(devfmts, " S16BE");
  }
  if (device_info->format & CUBEB_DEVICE_FMT_F32LE) {
    strcat(devfmts, " F32LE");
  }
  if (device_info->format & CUBEB_DEVICE_FMT_F32BE) {
    strcat(devfmts, " F32BE");
  }

  LOG("DeviceID: \"%s\"%s\n"
      "\tName:\t\"%s\"\n"
      "\tGroup:\t\"%s\"\n"
      "\tVendor:\t\"%s\"\n"
      "\tType:\t%s\n"
      "\tState:\t%s\n"
      "\tMaximum channels:\t%u\n"
      "\tFormat:\t%s (0x%x) (default: %s)\n"
      "\tRate:\t[%u, %u] (default: %u)\n"
      "\tLatency: lo %u frames, hi %u frames",
      device_info->device_id, device_info->preferred ? " (PREFERRED)" : "",
      device_info->friendly_name, device_info->group_id,
      device_info->vendor_name, devtype, devstate, device_info->max_channels,
      (devfmts[0] == '\0') ? devfmts : devfmts + 1,
      (unsigned int)device_info->format, devdeffmt, device_info->min_rate,
      device_info->max_rate, device_info->default_rate, device_info->latency_lo,
      device_info->latency_hi);
}